

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeBitfieldMaskOperand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  DecodeStatus local_3c;
  DecodeStatus local_38;
  DecodeStatus S;
  uint32_t msb_mask;
  uint32_t lsb_mask;
  uint lsb;
  uint msb;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_10;
  uint Val_local;
  MCInst *Inst_local;
  
  _lsb = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Val;
  pMStack_10 = Inst;
  lsb_mask = fieldFromInstruction_4(Val,5,5);
  msb_mask = fieldFromInstruction_4(Address_local._4_4_,0,5);
  local_3c = MCDisassembler_Success;
  if (lsb_mask < msb_mask) {
    Check(&local_3c,MCDisassembler_SoftFail);
    msb_mask = lsb_mask;
  }
  local_38 = ~MCDisassembler_Fail;
  if (lsb_mask != 0x1f) {
    local_38 = (1 << ((char)lsb_mask + 1U & 0x1f)) - MCDisassembler_SoftFail;
  }
  S = (1 << ((byte)msb_mask & 0x1f)) - MCDisassembler_SoftFail;
  MCOperand_CreateImm0(pMStack_10,(ulong)(local_38 ^ S ^ ~MCDisassembler_Fail));
  return local_3c;
}

Assistant:

static DecodeStatus DecodeBitfieldMaskOperand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	// This operand encodes a mask of contiguous zeros between a specified MSB
	// and LSB.  To decode it, we create the mask of all bits MSB-and-lower,
	// the mask of all bits LSB-and-lower, and then xor them to create
	// the mask of that's all ones on [msb, lsb].  Finally we not it to
	// create the final mask.
	unsigned msb = fieldFromInstruction_4(Val, 5, 5);
	unsigned lsb = fieldFromInstruction_4(Val, 0, 5);
	uint32_t lsb_mask, msb_mask;

	DecodeStatus S = MCDisassembler_Success;
	if (lsb > msb) {
		Check(&S, MCDisassembler_SoftFail);
		// The check above will cause the warning for the "potentially undefined
		// instruction encoding" but we can't build a bad MCOperand value here
		// with a lsb > msb or else printing the MCInst will cause a crash.
		lsb = msb;
	}

	msb_mask = 0xFFFFFFFF;
	if (msb != 31) msb_mask = (1U << (msb+1)) - 1;
	lsb_mask = (1U << lsb) - 1;

	MCOperand_CreateImm0(Inst, ~(msb_mask ^ lsb_mask));
	return S;
}